

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ShaderOptimizationCase::init
          (ShaderOptimizationCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  TestLog *log;
  ShaderProgram *pSVar1;
  TestError *this_00;
  char *pcVar2;
  ProgramSources *this_01;
  SharedPtr<const_glu::ShaderProgram> *this_02;
  int iVar3;
  allocator<char> local_16a;
  allocator<char> local_169;
  ScopedLogSection section;
  string local_138;
  ProgramData local_118;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deqp::gls::ShaderPerformanceMeasurer::logParameters(&this->m_measurer,log);
  pSVar1 = (ShaderProgram *)&this->m_optimizedData;
  iVar3 = 2;
  do {
    if (iVar3 == 0) {
      this->m_state = STATE_INIT_UNOPTIMIZED;
      return (int)pSVar1;
    }
    this_01 = &(this->m_unoptimizedData).sources;
    if (iVar3 == 1) {
      this_01 = &(this->m_optimizedData).sources;
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_118,this,(ulong)(iVar3 == 1));
    glu::ProgramSources::operator=(this_01,&local_118.sources);
    std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::_M_move_assign
              ((vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> *)
               (this_01 + 1),&local_118.attributes);
    ProgramData::~ProgramData(&local_118);
    pSVar1 = (ShaderProgram *)operator_new(0xd0);
    glu::ShaderProgram::ShaderProgram(pSVar1,renderCtx,this_01);
    de::SharedPtr<const_glu::ShaderProgram>::SharedPtr
              ((SharedPtr<const_glu::ShaderProgram> *)&local_118,pSVar1);
    this_02 = &this->m_unoptimizedProgram + (iVar3 == 1);
    de::SharedPtr<const_glu::ShaderProgram>::operator=
              (this_02,(SharedPtr<const_glu::ShaderProgram> *)&local_118);
    de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr
              ((SharedPtr<const_glu::ShaderProgram> *)&local_118);
    pcVar2 = "UnoptimizedProgram";
    if (iVar3 == 1) {
      pcVar2 = "OptimizedProgram";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar2,&local_169);
    pcVar2 = "Unoptimized program";
    if (iVar3 == 1) {
      pcVar2 = "Hand-optimized program";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar2,&local_16a);
    tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&local_118,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    glu::operator<<(log,this_02->m_ptr);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pSVar1 = this_02->m_ptr;
    iVar3 = iVar3 + -1;
  } while ((pSVar1->m_program).m_info.linkOk != false);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOptimizationTests.cpp"
             ,0xf5);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderOptimizationCase::init (void)
{
	const glu::RenderContext&	renderCtx	= m_context.getRenderContext();
	TestLog&					log			= m_testCtx.getLog();

	m_measurer.logParameters(log);

	for (int ndx = 0; ndx < 2; ndx++)
	{
		const bool optimized = ndx == 1;

		programData(optimized) = generateProgramData(optimized);

		for (int i = 0; i < (int)programData(optimized).attributes.size(); i++)
			DE_ASSERT(programData(optimized).attributes[i].name != "a_position"); // \note Position attribute is set by m_measurer.

		program(optimized) = SharedPtr<const ShaderProgram>(new ShaderProgram(renderCtx, programData(optimized).sources));

		{
			const tcu::ScopedLogSection section(log, optimized ? "OptimizedProgram"			: "UnoptimizedProgram",
													 optimized ? "Hand-optimized program"	: "Unoptimized program");
			log << *program(optimized);
		}

		if (!program(optimized)->isOk())
			TCU_FAIL("Shader compilation failed");
	}

	m_state = STATE_INIT_UNOPTIMIZED;
}